

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schedule.hpp
# Opt level: O0

void __thiscall Schedule::restoreAndDumpToFile(Schedule *this,string *path)

{
  bool bVar1;
  element_type *peVar2;
  ostream *this_00;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_258 [3];
  ostream local_228 [8];
  ofstream file;
  undefined1 local_28 [8];
  json json;
  string *path_local;
  Schedule *this_local;
  
  json.m_value = (json_value)path;
  peVar2 = std::__shared_ptr_access<Common,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Common,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)this)
  ;
  Common::restore(peVar2,&this->head);
  peVar2 = std::__shared_ptr_access<Common,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Common,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)this)
  ;
  bVar1 = Common::check(peVar2,&this->head);
  if (!bVar1) {
    error("Check failed while dumping to file.\n");
  }
  peVar2 = std::__shared_ptr_access<Common,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Common,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)this)
  ;
  Common::toJson_abi_cxx11_((Common *)local_28,(TaskHandle *)peVar2);
  std::ofstream::ofstream(local_228,json.m_value.object,0x10);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::dump(local_258,(int)local_28,'\x04',true,strict);
  this_00 = std::operator<<(local_228,(string *)local_258);
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)local_258);
  std::ofstream::~ofstream(local_228);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 *)local_28);
  return;
}

Assistant:

void restoreAndDumpToFile(const std::string &path) {
        // Restore to the format with attributes, .dealloc and .share
        common->restore(head);
        if (not common->check(head)) {
            error("Check failed while dumping to file.\n");
        }

        // Dump into json
        auto json = common->toJson(head);
        std::ofstream file(path);
        file << json.dump(4) << std::endl;
    }